

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_program_binary(NegativeTestContext *ctx)

{
  ostringstream *poVar1;
  RenderContext *pRVar2;
  GLint bufSize;
  GLint binaryPtr;
  GLint linkStatus;
  GLenum binaryFormat;
  GLsizei binaryLength;
  ShaderProgram programInvalid;
  ShaderProgram program;
  GLint local_388;
  allocator<char> local_381;
  undefined4 local_380;
  GLint local_37c;
  string local_378;
  string local_358;
  MessageBuilder local_338;
  ShaderProgram local_1b8;
  ShaderProgram local_e8;
  
  pRVar2 = ctx->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,
             "#version 300 es\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n",
             (allocator<char> *)&local_358);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,
             "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(0.0);\n}\n"
             ,(allocator<char> *)&local_380);
  glu::makeVtxFragSources((ProgramSources *)&local_338,(string *)&local_1b8,&local_378);
  glu::ShaderProgram::ShaderProgram(&local_e8,pRVar2,(ProgramSources *)&local_338);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&local_338);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_1b8);
  pRVar2 = ctx->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,
             "#version 300 es\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n",
             (allocator<char> *)&local_380);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,SSBOArrayLengthTests::init::arraysSized + 1,
             (allocator<char> *)&local_388);
  glu::makeVtxFragSources((ProgramSources *)&local_338,&local_378,&local_358);
  glu::ShaderProgram::ShaderProgram(&local_1b8,pRVar2,(ProgramSources *)&local_338);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&local_338);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  local_378._M_dataplus._M_p._0_4_ = 0xffffffff;
  local_358._M_dataplus._M_p._0_4_ = 0xffffffff;
  local_380 = 0xffffffff;
  local_388 = -1;
  local_37c = -1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,
             "GL_INVALID_OPERATION is generated if bufSize is less than the size of GL_PROGRAM_BINARY_LENGTH for program."
             ,&local_381);
  NegativeTestContext::beginSection(ctx,(string *)&local_338);
  std::__cxx11::string::~string((string *)&local_338);
  glu::CallLogWrapper::glGetProgramiv
            (&ctx->super_CallLogWrapper,local_e8.m_program.m_program,0x8741,&local_388);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glGetProgramiv
            (&ctx->super_CallLogWrapper,local_e8.m_program.m_program,0x8b82,&local_37c);
  local_338.m_log = (ctx->super_CallLogWrapper).m_log;
  poVar1 = &local_338.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"// GL_PROGRAM_BINARY_LENGTH = ");
  std::ostream::operator<<(poVar1,local_388);
  tcu::MessageBuilder::operator<<(&local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  local_338.m_log = (ctx->super_CallLogWrapper).m_log;
  poVar1 = &local_338.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"// GL_LINK_STATUS = ");
  std::ostream::operator<<(poVar1,local_37c);
  tcu::MessageBuilder::operator<<(&local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glGetProgramBinary
            (&ctx->super_CallLogWrapper,local_e8.m_program.m_program,0,(GLsizei *)&local_358,
             (GLenum *)&local_378,&local_380);
  NegativeTestContext::expectError(ctx,0x502);
  if (0 < local_388) {
    glu::CallLogWrapper::glGetProgramBinary
              (&ctx->super_CallLogWrapper,local_e8.m_program.m_program,local_388 + -1,
               (GLsizei *)&local_358,(GLenum *)&local_378,&local_380);
    NegativeTestContext::expectError(ctx,0x502);
  }
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,
             "GL_INVALID_OPERATION is generated if GL_LINK_STATUS for the program object is false.",
             &local_381);
  NegativeTestContext::beginSection(ctx,(string *)&local_338);
  std::__cxx11::string::~string((string *)&local_338);
  glu::CallLogWrapper::glGetProgramiv
            (&ctx->super_CallLogWrapper,local_1b8.m_program.m_program,0x8741,&local_388);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glGetProgramiv
            (&ctx->super_CallLogWrapper,local_1b8.m_program.m_program,0x8b82,&local_37c);
  local_338.m_log = (ctx->super_CallLogWrapper).m_log;
  poVar1 = &local_338.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"// GL_PROGRAM_BINARY_LENGTH = ");
  std::ostream::operator<<(poVar1,local_388);
  tcu::MessageBuilder::operator<<(&local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  local_338.m_log = (ctx->super_CallLogWrapper).m_log;
  poVar1 = &local_338.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"// GL_LINK_STATUS = ");
  std::ostream::operator<<(poVar1,local_37c);
  tcu::MessageBuilder::operator<<(&local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glGetProgramBinary
            (&ctx->super_CallLogWrapper,local_1b8.m_program.m_program,local_388,
             (GLsizei *)&local_358,(GLenum *)&local_378,&local_380);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram(&local_1b8);
  glu::ShaderProgram::~ShaderProgram(&local_e8);
  return;
}

Assistant:

void get_program_binary (NegativeTestContext& ctx)
{
	glu::ShaderProgram				program			(ctx.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));
	glu::ShaderProgram				programInvalid	(ctx.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, ""));
	GLenum							binaryFormat	= -1;
	GLsizei							binaryLength	= -1;
	GLint							binaryPtr		= -1;
	GLint							bufSize			= -1;
	GLint							linkStatus		= -1;

	ctx.beginSection("GL_INVALID_OPERATION is generated if bufSize is less than the size of GL_PROGRAM_BINARY_LENGTH for program.");
	ctx.glGetProgramiv		(program.getProgram(), GL_PROGRAM_BINARY_LENGTH,	&bufSize);
	ctx.expectError		(GL_NO_ERROR);
	ctx.glGetProgramiv		(program.getProgram(), GL_LINK_STATUS,				&linkStatus);
	ctx.getLog() << TestLog::Message << "// GL_PROGRAM_BINARY_LENGTH = " << bufSize << TestLog::EndMessage;
	ctx.getLog() << TestLog::Message << "// GL_LINK_STATUS = " << linkStatus << TestLog::EndMessage;
	ctx.expectError		(GL_NO_ERROR);

	ctx.glGetProgramBinary	(program.getProgram(), 0, &binaryLength, &binaryFormat, &binaryPtr);
	ctx.expectError		(GL_INVALID_OPERATION);
	if (bufSize > 0)
	{
		ctx.glGetProgramBinary	(program.getProgram(), bufSize-1, &binaryLength, &binaryFormat, &binaryPtr);
		ctx.expectError		(GL_INVALID_OPERATION);
	}
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if GL_LINK_STATUS for the program object is false.");
	ctx.glGetProgramiv		(programInvalid.getProgram(), GL_PROGRAM_BINARY_LENGTH,	&bufSize);
	ctx.expectError		(GL_NO_ERROR);
	ctx.glGetProgramiv		(programInvalid.getProgram(), GL_LINK_STATUS,			&linkStatus);
	ctx.getLog() << TestLog::Message << "// GL_PROGRAM_BINARY_LENGTH = " << bufSize << TestLog::EndMessage;
	ctx.getLog() << TestLog::Message << "// GL_LINK_STATUS = " << linkStatus << TestLog::EndMessage;
	ctx.expectError		(GL_NO_ERROR);

	ctx.glGetProgramBinary	(programInvalid.getProgram(), bufSize, &binaryLength, &binaryFormat, &binaryPtr);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.endSection();
}